

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O0

int matchNonSingletonOutputs
              (Abc_Ntk_t *pNtk1,Vec_Ptr_t **nodesInLevel1,Vec_Int_t **iMatch1,Vec_Int_t **iDep1,
              Vec_Int_t *matchedInputs1,int *iGroup1,Vec_Int_t **oMatch1,int *oGroup1,
              Abc_Ntk_t *pNtk2,Vec_Ptr_t **nodesInLevel2,Vec_Int_t **iMatch2,Vec_Int_t **iDep2,
              Vec_Int_t *matchedInputs2,int *iGroup2,Vec_Int_t **oMatch2,int *oGroup2,
              Vec_Int_t *matchedOutputs1,Vec_Int_t *matchedOutputs2,Vec_Int_t *oMatchedGroups,
              Vec_Int_t *iNonSingleton,Abc_Ntk_t *subNtk1,Abc_Ntk_t *subNtk2,Vec_Ptr_t *oMatchPairs,
              Vec_Int_t *oNonSingleton,int oI,int idx,int ii,int iidx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *mismatch_00;
  void *__ptr;
  Abc_Obj_t *pAVar4;
  void *__ptr_00;
  int *pModel_00;
  int *__ptr_01;
  int *__ptr_02;
  char *vPiValues;
  int *pModel;
  Abc_Obj_t *pObj;
  int k;
  int *output2;
  int *output1;
  int *skipList;
  Vec_Int_t *mismatch;
  int local_70;
  int temp;
  int j;
  int i;
  int *iGroup1_local;
  Vec_Int_t *matchedInputs1_local;
  Vec_Int_t **iDep1_local;
  Vec_Int_t **iMatch1_local;
  Vec_Ptr_t **nodesInLevel1_local;
  Abc_Ntk_t *pNtk1_local;
  
  matchNonSingletonOutputs::MATCH_FOUND = 0;
  iVar1 = Vec_IntSize(oNonSingleton);
  if (oI == iVar1) {
    if ((iNonSingleton != (Vec_Int_t *)0x0) &&
       (iVar1 = match1by1(pNtk1,nodesInLevel1,iMatch1,iDep1,matchedInputs1,iGroup1,oMatch1,oGroup1,
                          pNtk2,nodesInLevel2,iMatch2,iDep2,matchedInputs2,iGroup2,oMatch2,oGroup2,
                          matchedOutputs1,matchedOutputs2,oMatchedGroups,iNonSingleton,ii,iidx),
       iVar1 != 0)) {
      matchNonSingletonOutputs::MATCH_FOUND = 1;
    }
    if (iNonSingleton == (Vec_Int_t *)0x0) {
      matchNonSingletonOutputs::MATCH_FOUND = 1;
    }
  }
  else {
    iVar1 = Vec_IntEntry(oNonSingleton,oI);
    mismatch_00 = Vec_IntAlloc(10);
    iVar2 = Vec_IntSize(oMatch1[iVar1]);
    __ptr = malloc((long)iVar2 << 2);
    for (local_70 = 0; iVar2 = Vec_IntSize(oMatch1[iVar1]), local_70 < iVar2;
        local_70 = local_70 + 1) {
      *(undefined4 *)((long)__ptr + (long)local_70 * 4) = 0;
    }
    iVar2 = Vec_IntEntry(oMatch1[iVar1],idx);
    pAVar4 = Abc_NtkPo(subNtk1,iVar2);
    Vec_PtrPush(oMatchPairs,pAVar4);
    iVar2 = Vec_IntEntry(oMatch1[iVar1],idx);
    Vec_IntPush(matchedOutputs1,iVar2);
    for (local_70 = 0; iVar2 = Vec_IntSize(oMatch2[iVar1]),
        local_70 < iVar2 && matchNonSingletonOutputs::MATCH_FOUND == 0; local_70 = local_70 + 1) {
      iVar2 = Vec_IntEntry(oMatch2[iVar1],local_70);
      if ((iVar2 != -1) && (*(int *)((long)__ptr + (long)local_70 * 4) != 1)) {
        iVar2 = Vec_IntEntry(oMatch2[iVar1],local_70);
        pAVar4 = Abc_NtkPo(subNtk2,iVar2);
        Vec_PtrPush(oMatchPairs,pAVar4);
        iVar2 = Vec_IntEntry(oMatch2[iVar1],local_70);
        Vec_IntPush(matchedOutputs2,iVar2);
        matchNonSingletonOutputs::counter = matchNonSingletonOutputs::counter + 1;
        iVar2 = Abc_NtkBmSat(subNtk1,subNtk2,(Vec_Ptr_t *)0x0,oMatchPairs,mismatch_00,0);
        if (iVar2 == 0) {
          iVar2 = Abc_NtkPiNum(subNtk1);
          __ptr_00 = malloc((long)(iVar2 + 1));
          iVar2 = Abc_NtkPiNum(subNtk1);
          *(undefined1 *)((long)__ptr_00 + (long)iVar2) = 0;
          for (pObj._4_4_ = 0; iVar2 = Abc_NtkPiNum(subNtk1), pObj._4_4_ < iVar2;
              pObj._4_4_ = pObj._4_4_ + 1) {
            *(undefined1 *)((long)__ptr_00 + (long)pObj._4_4_) = 0x30;
          }
          for (pObj._4_4_ = 0; iVar2 = Vec_IntSize(mismatch_00), pObj._4_4_ < iVar2;
              pObj._4_4_ = pObj._4_4_ + 2) {
            iVar2 = Vec_IntEntry(mismatch_00,pObj._4_4_ + 1);
            iVar3 = Vec_IntEntry(mismatch_00,pObj._4_4_);
            *(char *)((long)__ptr_00 + (long)iVar3) = (char)iVar2;
          }
          iVar2 = Abc_NtkCiNum(subNtk1);
          pModel_00 = (int *)malloc((long)iVar2 << 2);
          for (pObj._4_4_ = 0; iVar2 = Abc_NtkPiNum(subNtk1), pObj._4_4_ < iVar2;
              pObj._4_4_ = pObj._4_4_ + 1) {
            Abc_NtkPi(subNtk1,pObj._4_4_);
            pModel_00[pObj._4_4_] = *(char *)((long)__ptr_00 + (long)pObj._4_4_) + -0x30;
          }
          for (pObj._4_4_ = 0; iVar2 = Vec_PtrSize(subNtk1->vBoxes), pObj._4_4_ < iVar2;
              pObj._4_4_ = pObj._4_4_ + 1) {
            pAVar4 = Abc_NtkBox(subNtk1,pObj._4_4_);
            iVar2 = Abc_ObjIsLatch(pAVar4);
            if (iVar2 != 0) {
              iVar2 = (pAVar4->field_5).iData;
              iVar3 = Abc_NtkPiNum(subNtk1);
              pModel_00[iVar3 + pObj._4_4_] = iVar2 + -1;
            }
          }
          __ptr_01 = Abc_NtkVerifySimulatePattern(subNtk1,pModel_00);
          for (pObj._4_4_ = 0; iVar2 = Vec_PtrSize(subNtk2->vBoxes), pObj._4_4_ < iVar2;
              pObj._4_4_ = pObj._4_4_ + 1) {
            pAVar4 = Abc_NtkBox(subNtk2,pObj._4_4_);
            iVar2 = Abc_ObjIsLatch(pAVar4);
            if (iVar2 != 0) {
              iVar2 = (pAVar4->field_5).iData;
              iVar3 = Abc_NtkPiNum(subNtk2);
              pModel_00[iVar3 + pObj._4_4_] = iVar2 + -1;
            }
          }
          __ptr_02 = Abc_NtkVerifySimulatePattern(subNtk2,pModel_00);
          for (pObj._4_4_ = 0; iVar2 = Vec_IntSize(oMatch1[iVar1]), pObj._4_4_ < iVar2;
              pObj._4_4_ = pObj._4_4_ + 1) {
            iVar2 = Vec_IntEntry(oMatch1[iVar1],idx);
            iVar2 = __ptr_01[iVar2];
            iVar3 = Vec_IntEntry(oMatch2[iVar1],pObj._4_4_);
            if (iVar2 != __ptr_02[iVar3]) {
              *(undefined4 *)((long)__ptr + (long)pObj._4_4_ * 4) = 1;
            }
          }
          if (__ptr_00 != (void *)0x0) {
            free(__ptr_00);
          }
          if (pModel_00 != (int *)0x0) {
            free(pModel_00);
          }
          if (__ptr_01 != (int *)0x0) {
            free(__ptr_01);
          }
          if (__ptr_02 != (int *)0x0) {
            free(__ptr_02);
          }
        }
        else {
          iVar2 = Vec_IntEntry(oMatch2[iVar1],local_70);
          Vec_IntWriteEntry(oMatch2[iVar1],local_70,-1);
          iVar3 = Vec_IntSize(oMatch1[iVar1]);
          if (idx == iVar3 + -1) {
            matchNonSingletonOutputs
                      (pNtk1,nodesInLevel1,iMatch1,iDep1,matchedInputs1,iGroup1,oMatch1,oGroup1,
                       pNtk2,nodesInLevel2,iMatch2,iDep2,matchedInputs2,iGroup2,oMatch2,oGroup2,
                       matchedOutputs1,matchedOutputs2,oMatchedGroups,iNonSingleton,subNtk1,subNtk2,
                       oMatchPairs,oNonSingleton,oI + 1,0,ii,iidx);
          }
          else {
            matchNonSingletonOutputs
                      (pNtk1,nodesInLevel1,iMatch1,iDep1,matchedInputs1,iGroup1,oMatch1,oGroup1,
                       pNtk2,nodesInLevel2,iMatch2,iDep2,matchedInputs2,iGroup2,oMatch2,oGroup2,
                       matchedOutputs1,matchedOutputs2,oMatchedGroups,iNonSingleton,subNtk1,subNtk2,
                       oMatchPairs,oNonSingleton,oI,idx + 1,ii,iidx);
          }
          Vec_IntWriteEntry(oMatch2[iVar1],local_70,iVar2);
        }
        if (matchNonSingletonOutputs::MATCH_FOUND == 0) {
          Vec_PtrPop(oMatchPairs);
          Vec_IntPop(matchedOutputs2);
        }
      }
    }
    if (matchNonSingletonOutputs::MATCH_FOUND == 0) {
      Vec_PtrPop(oMatchPairs);
      Vec_IntPop(matchedOutputs1);
    }
    if ((matchNonSingletonOutputs::MATCH_FOUND != 0) && (matchNonSingletonOutputs::counter != 0)) {
      matchNonSingletonOutputs::counter = 0;
    }
    if (mismatch_00 != (Vec_Int_t *)0x0) {
      free(mismatch_00);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
  }
  return matchNonSingletonOutputs::MATCH_FOUND;
}

Assistant:

int matchNonSingletonOutputs(Abc_Ntk_t * pNtk1, Vec_Ptr_t ** nodesInLevel1, Vec_Int_t ** iMatch1, Vec_Int_t ** iDep1, Vec_Int_t * matchedInputs1, int * iGroup1, Vec_Int_t ** oMatch1, int * oGroup1,
                              Abc_Ntk_t * pNtk2, Vec_Ptr_t ** nodesInLevel2, Vec_Int_t ** iMatch2, Vec_Int_t ** iDep2, Vec_Int_t * matchedInputs2, int * iGroup2, Vec_Int_t ** oMatch2, int * oGroup2,
                              Vec_Int_t * matchedOutputs1, Vec_Int_t * matchedOutputs2, Vec_Int_t * oMatchedGroups, Vec_Int_t * iNonSingleton,                         
                              Abc_Ntk_t * subNtk1, Abc_Ntk_t * subNtk2, Vec_Ptr_t * oMatchPairs,
                              Vec_Int_t * oNonSingleton, int oI, int idx, int ii, int iidx)
{        
    static int MATCH_FOUND;
    int i;
    int j, temp;
    Vec_Int_t * mismatch;        
    int * skipList;    
    static int counter = 0;

    MATCH_FOUND = FALSE;
    
    if( oI == Vec_IntSize( oNonSingleton ) )
    {
        if( iNonSingleton != NULL)            
            if( match1by1(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                          pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                           matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton, ii, iidx) )
                MATCH_FOUND = TRUE;    

        if( iNonSingleton == NULL)
            MATCH_FOUND = TRUE;

        return MATCH_FOUND;
    }

    i = Vec_IntEntry(oNonSingleton, oI);

    mismatch = Vec_IntAlloc(10);
    
    skipList = ABC_ALLOC(int, Vec_IntSize(oMatch1[i]));

    for(j = 0; j < Vec_IntSize(oMatch1[i]); j++)
        skipList[j] = FALSE;

    Vec_PtrPush(oMatchPairs, Abc_NtkPo(subNtk1, Vec_IntEntry(oMatch1[i], idx)) );
    Vec_IntPush(matchedOutputs1, Vec_IntEntry(oMatch1[i], idx));

    for(j = 0; j < Vec_IntSize( oMatch2[i] ) && MATCH_FOUND == FALSE; j++)
    {
        if( Vec_IntEntry(oMatch2[i], j) == -1 || skipList[j] == TRUE)
            continue;

        Vec_PtrPush(oMatchPairs, Abc_NtkPo(subNtk2, Vec_IntEntry(oMatch2[i], j)));
        Vec_IntPush(matchedOutputs2, Vec_IntEntry(oMatch2[i], j));

        counter++;        
        if( Abc_NtkBmSat( subNtk1, subNtk2, NULL, oMatchPairs, mismatch, 0) )
        {
            /*fprintf(matchFile, "%s matched to %s\n", Abc_ObjName(Abc_NtkPo(pNtk1, Vec_IntEntry(oMatch1[i], idx))), 
                                         Abc_ObjName(Abc_NtkPo(pNtk2, Vec_IntEntry(oMatch2[i], j))));            */

            temp =  Vec_IntEntry(oMatch2[i], j);
            Vec_IntWriteEntry(oMatch2[i], j, -1);
            
            if(idx != Vec_IntSize( oMatch1[i] ) - 1)
                // call the same function with idx+1
                matchNonSingletonOutputs(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                                         pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                                         matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton,                         
                                         subNtk1, subNtk2, oMatchPairs,
                                         oNonSingleton, oI, idx+1, ii, iidx);
            else    
                // call the same function with idx = 0 and oI++
                matchNonSingletonOutputs(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                                         pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                                         matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton,                         
                                         subNtk1, subNtk2, oMatchPairs,
                                         oNonSingleton, oI+1, 0, ii, iidx);

            Vec_IntWriteEntry(oMatch2[i], j, temp);
        }        
        else
        {
            int * output1, * output2;
            int k;
            Abc_Obj_t * pObj;
            int * pModel;
            char * vPiValues;            
            

            vPiValues = ABC_ALLOC( char,  Abc_NtkPiNum(subNtk1) + 1);
            vPiValues[Abc_NtkPiNum(subNtk1)] = '\0';    
            
            for(k = 0; k < Abc_NtkPiNum(subNtk1); k++)
                vPiValues[k] = '0';

            for(k = 0; k < Vec_IntSize(mismatch); k += 2)            
                vPiValues[Vec_IntEntry(mismatch, k)] = Vec_IntEntry(mismatch, k+1);                        

            pModel = ABC_ALLOC( int, Abc_NtkCiNum(subNtk1) );    

            Abc_NtkForEachPi( subNtk1, pObj, k )
                pModel[k] = vPiValues[k] - '0';
            Abc_NtkForEachLatch( subNtk1, pObj, k )
                pModel[Abc_NtkPiNum(subNtk1)+k] = pObj->iData - 1;            
    
            output1 = Abc_NtkVerifySimulatePattern( subNtk1, pModel );

            Abc_NtkForEachLatch( subNtk2, pObj, k )
                pModel[Abc_NtkPiNum(subNtk2)+k] = pObj->iData - 1;

            output2 = Abc_NtkVerifySimulatePattern( subNtk2, pModel );
            

            for(k = 0; k < Vec_IntSize( oMatch1[i] ); k++)
                if(output1[Vec_IntEntry(oMatch1[i], idx)] != output2[Vec_IntEntry(oMatch2[i], k)])
                {
                    skipList[k] = TRUE;    
                    /*printf("Output is SKIPPED");*/
                }
                
            ABC_FREE( vPiValues );
            ABC_FREE( pModel );
            ABC_FREE( output1 );
            ABC_FREE( output2 );
        }
        
        if(MATCH_FOUND == FALSE )
        {
            Vec_PtrPop(oMatchPairs);
            Vec_IntPop(matchedOutputs2);
        }
    }

    if(MATCH_FOUND == FALSE )
    {
        Vec_PtrPop(oMatchPairs);
        Vec_IntPop(matchedOutputs1);
    }

    if(MATCH_FOUND && counter != 0)
    {        
        /*printf("Number of OUTPUT SAT instances = %d", counter);*/
        counter = 0;
    }

    ABC_FREE( mismatch );
    ABC_FREE( skipList );

    return MATCH_FOUND;
}